

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void idct64_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i alVar8;
  undefined1 auVar9 [32];
  undefined1 *puVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  __m256i cospi32;
  __m256i cospim32;
  __m256i cospim48;
  __m256i cospim16;
  __m256i cospi48;
  __m256i cospi16;
  __m256i clamp_hi;
  __m256i clamp_lo;
  __m256i rnding;
  undefined1 local_d40 [32];
  int local_c80;
  int iStack_c7c;
  int iStack_c78;
  int iStack_c74;
  int iStack_c70;
  int iStack_c6c;
  int iStack_c68;
  int iStack_c64;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [16];
  undefined1 auStack_bd0 [16];
  undefined1 local_bc0 [32];
  int local_ba0;
  int iStack_b9c;
  int iStack_b98;
  int iStack_b94;
  int iStack_b90;
  int iStack_b8c;
  int iStack_b88;
  int iStack_b84;
  int local_b80;
  int iStack_b7c;
  int iStack_b78;
  int iStack_b74;
  int iStack_b70;
  int iStack_b6c;
  int iStack_b68;
  int iStack_b64;
  int local_b60;
  int iStack_b5c;
  int iStack_b58;
  int iStack_b54;
  int iStack_b50;
  int iStack_b4c;
  int iStack_b48;
  int iStack_b44;
  int local_b40;
  int iStack_b3c;
  int iStack_b38;
  int iStack_b34;
  int iStack_b30;
  int iStack_b2c;
  int iStack_b28;
  int iStack_b24;
  int local_b20;
  int iStack_b1c;
  int iStack_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  int iStack_b08;
  int iStack_b04;
  int local_b00;
  int iStack_afc;
  int iStack_af8;
  int iStack_af4;
  int iStack_af0;
  int iStack_aec;
  int iStack_ae8;
  int iStack_ae4;
  int local_ae0;
  int iStack_adc;
  int iStack_ad8;
  int iStack_ad4;
  int iStack_ad0;
  int iStack_acc;
  int iStack_ac8;
  int iStack_ac4;
  int local_ac0;
  int iStack_abc;
  int iStack_ab8;
  int iStack_ab4;
  int iStack_ab0;
  int iStack_aac;
  int iStack_aa8;
  int iStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  __m256i local_860;
  __m256i local_840;
  __m256i local_820;
  __m256i local_800;
  longlong local_7e0;
  longlong lStack_7d8;
  longlong lStack_7d0;
  longlong lStack_7c8;
  longlong local_7c0;
  longlong lStack_7b8;
  longlong lStack_7b0;
  longlong lStack_7a8;
  longlong local_7a0;
  longlong lStack_798;
  longlong lStack_790;
  longlong lStack_788;
  longlong local_780;
  longlong lStack_778;
  longlong lStack_770;
  longlong lStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  lVar14 = (long)bit * 0x100;
  local_ac0 = 1 << ((char)bit - 1U & 0x1f);
  iVar17 = bd + (uint)(do_cols == 0) * 2;
  local_b00 = 0x8000;
  if (0xf < iVar17 + 6) {
    local_b00 = 1 << ((char)iVar17 + 5U & 0x1f);
  }
  local_ae0 = -local_b00;
  local_b00 = local_b00 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x164);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x168);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar27._16_4_ = uVar1;
  auVar27._20_4_ = uVar1;
  auVar27._24_4_ = uVar1;
  auVar27._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x16c);
  auVar31._4_4_ = uVar1;
  auVar31._0_4_ = uVar1;
  auVar31._8_4_ = uVar1;
  auVar31._12_4_ = uVar1;
  auVar31._16_4_ = uVar1;
  auVar31._20_4_ = uVar1;
  auVar31._24_4_ = uVar1;
  auVar31._28_4_ = uVar1;
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x170);
  local_d40._4_4_ = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x178);
  local_d40._0_4_ = local_d40._4_4_;
  local_d40._8_4_ = local_d40._4_4_;
  local_d40._12_4_ = local_d40._4_4_;
  local_d40._16_4_ = local_d40._4_4_;
  local_d40._20_4_ = local_d40._4_4_;
  local_d40._24_4_ = local_d40._4_4_;
  local_d40._28_4_ = local_d40._4_4_;
  local_b20 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1a0);
  local_b60 = -local_b20;
  local_c80 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1e0);
  local_ba0 = -local_c80;
  local_b40 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x220);
  iVar11 = -iVar17;
  local_b80 = -local_b40;
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar14 + 0x244);
  iVar16 = -*(int *)((long)vert_filter_length_chroma + lVar14 + 0x254);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x25c);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar38._16_4_ = uVar1;
  auVar38._20_4_ = uVar1;
  auVar38._24_4_ = uVar1;
  auVar38._28_4_ = uVar1;
  auVar43._4_4_ = iVar12;
  auVar43._0_4_ = iVar12;
  auVar43._8_4_ = iVar12;
  auVar43._12_4_ = iVar12;
  auVar43._16_4_ = iVar12;
  auVar43._20_4_ = iVar12;
  auVar43._24_4_ = iVar12;
  auVar43._28_4_ = iVar12;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x17c);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar19._16_4_ = uVar1;
  auVar19._20_4_ = uVar1;
  auVar19._24_4_ = uVar1;
  auVar19._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x174);
  auVar20._4_4_ = uVar1;
  auVar20._0_4_ = uVar1;
  auVar20._8_4_ = uVar1;
  auVar20._12_4_ = uVar1;
  auVar20._16_4_ = uVar1;
  auVar20._20_4_ = uVar1;
  auVar20._24_4_ = uVar1;
  auVar20._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x24c);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar39._16_4_ = uVar1;
  auVar39._20_4_ = uVar1;
  auVar39._24_4_ = uVar1;
  auVar39._28_4_ = uVar1;
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar14 + 0x248);
  auVar18._4_4_ = iVar16;
  auVar18._0_4_ = iVar16;
  auVar18._8_4_ = iVar16;
  auVar18._12_4_ = iVar16;
  auVar18._16_4_ = iVar16;
  auVar18._20_4_ = iVar16;
  auVar18._24_4_ = iVar16;
  auVar18._28_4_ = iVar16;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 600);
  auVar44._4_4_ = uVar1;
  auVar44._0_4_ = uVar1;
  auVar44._8_4_ = uVar1;
  auVar44._12_4_ = uVar1;
  auVar44._16_4_ = uVar1;
  auVar44._20_4_ = uVar1;
  auVar44._24_4_ = uVar1;
  auVar44._28_4_ = uVar1;
  auVar41._4_4_ = iVar12;
  auVar41._0_4_ = iVar12;
  auVar41._8_4_ = iVar12;
  auVar41._12_4_ = iVar12;
  auVar41._16_4_ = iVar12;
  auVar41._20_4_ = iVar12;
  auVar41._24_4_ = iVar12;
  auVar41._28_4_ = iVar12;
  puVar10 = local_460;
  auVar3 = vpmulld_avx2(auVar34,(undefined1  [32])in[1]);
  auVar4 = vpmulld_avx2(auVar38,(undefined1  [32])in[1]);
  auVar5 = vpmulld_avx2(auVar43,(undefined1  [32])in[7]);
  auVar6 = vpmulld_avx2(auVar19,(undefined1  [32])in[7]);
  auVar7 = vpmulld_avx2(auVar20,(undefined1  [32])in[5]);
  auVar19 = vpmulld_avx2(auVar39,(undefined1  [32])in[5]);
  auVar18 = vpmulld_avx2(auVar18,(undefined1  [32])in[3]);
  auVar20 = vpmulld_avx2(auVar31,(undefined1  [32])in[3]);
  auVar27 = vpmulld_avx2(auVar27,(undefined1  [32])in[2]);
  auVar31 = vpmulld_avx2(auVar44,(undefined1  [32])in[2]);
  auVar9._4_4_ = local_ac0;
  auVar9._0_4_ = local_ac0;
  auVar9._8_4_ = local_ac0;
  auVar9._12_4_ = local_ac0;
  auVar9._16_4_ = local_ac0;
  auVar9._20_4_ = local_ac0;
  auVar9._24_4_ = local_ac0;
  auVar9._28_4_ = local_ac0;
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  local_880 = vpsrad_avx2(auVar3,ZEXT416((uint)bit));
  auVar34 = vpmulld_avx2(auVar41,(undefined1  [32])in[6]);
  auVar23 = vpmulld_avx2((undefined1  [32])in[6],local_d40);
  auVar3 = vpaddd_avx2(auVar4,auVar9);
  local_8a0 = vpsrad_avx2(auVar3,ZEXT416((uint)bit));
  auVar21._4_4_ = iVar11;
  auVar21._0_4_ = iVar11;
  auVar21._8_4_ = iVar11;
  auVar21._12_4_ = iVar11;
  auVar21._16_4_ = iVar11;
  auVar21._20_4_ = iVar11;
  auVar21._24_4_ = iVar11;
  auVar21._28_4_ = iVar11;
  auVar3 = vpmulld_avx2(local_8a0,auVar21);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x250);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar4 = vpmulld_avx2(local_880,auVar45);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  auVar22._4_4_ = iVar17;
  auVar22._0_4_ = iVar17;
  auVar22._8_4_ = iVar17;
  auVar22._12_4_ = iVar17;
  auVar22._16_4_ = iVar17;
  auVar22._20_4_ = iVar17;
  auVar22._24_4_ = iVar17;
  auVar22._28_4_ = iVar17;
  local_80 = local_880;
  auVar4 = vpaddd_avx2(auVar5,auVar9);
  auVar40 = ZEXT416((uint)bit);
  local_8c0 = vpsrad_avx2(auVar4,auVar40);
  local_460 = local_8a0;
  auVar4 = vpaddd_avx2(auVar6,auVar9);
  local_8e0 = vpsrad_avx2(auVar4,auVar40);
  local_380 = local_8c0;
  auVar4 = vpaddd_avx2(auVar9,auVar7);
  local_9a0 = vpsrad_avx2(auVar4,auVar40);
  local_160 = local_8e0;
  auVar4 = vpaddd_avx2(auVar9,auVar19);
  local_9c0 = vpsrad_avx2(auVar4,auVar40);
  local_180 = local_9a0;
  auVar4 = vpaddd_avx2(auVar9,auVar18);
  auVar40 = ZEXT416((uint)bit);
  local_a60 = vpsrad_avx2(auVar4,auVar40);
  local_360 = local_9c0;
  auVar4 = vpaddd_avx2(auVar20,auVar9);
  local_a40 = vpsrad_avx2(auVar4,auVar40);
  local_280 = local_a60;
  auVar4 = vpaddd_avx2(auVar27,auVar9);
  local_480 = vpsrad_avx2(auVar4,auVar40);
  local_260 = local_a40;
  auVar4 = vpaddd_avx2(auVar9,auVar31);
  local_660 = vpsrad_avx2(auVar4,auVar40);
  auVar4 = vpaddd_avx2(auVar9,auVar34);
  local_580 = vpsrad_avx2(auVar4,auVar40);
  auVar4 = vpaddd_avx2(auVar9,auVar23);
  local_560 = vpsrad_avx2(auVar4,auVar40);
  auVar27 = vpmulld_avx2((undefined1  [32])in[4],auVar22);
  auVar34 = vpmulld_avx2((undefined1  [32])in[4],auVar45);
  auVar4 = vpmulld_avx2(local_8a0,auVar45);
  auVar5 = vpmulld_avx2(local_880,auVar22);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1d0);
  auVar23._4_4_ = iVar17;
  auVar23._0_4_ = iVar17;
  auVar23._8_4_ = iVar17;
  auVar23._12_4_ = iVar17;
  auVar23._16_4_ = iVar17;
  auVar23._20_4_ = iVar17;
  auVar23._24_4_ = iVar17;
  auVar23._28_4_ = iVar17;
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar14 + 0x1f0);
  auVar28._4_4_ = iVar12;
  auVar28._0_4_ = iVar12;
  auVar28._8_4_ = iVar12;
  auVar28._12_4_ = iVar12;
  auVar28._16_4_ = iVar12;
  auVar28._20_4_ = iVar12;
  auVar28._24_4_ = iVar12;
  auVar28._28_4_ = iVar12;
  auVar5 = vpmulld_avx2(local_8e0,auVar23);
  auVar5 = vpaddd_avx2(auVar9,auVar5);
  auVar6 = vpmulld_avx2(local_8c0,auVar28);
  auVar5 = vpaddd_avx2(auVar6,auVar5);
  iVar17 = -iVar17;
  auVar24._4_4_ = iVar17;
  auVar24._0_4_ = iVar17;
  auVar24._8_4_ = iVar17;
  auVar24._12_4_ = iVar17;
  auVar24._16_4_ = iVar17;
  auVar24._20_4_ = iVar17;
  auVar24._24_4_ = iVar17;
  auVar24._28_4_ = iVar17;
  auVar7 = vpmulld_avx2(local_8c0,auVar24);
  auVar6 = vpmulld_avx2(local_8e0,auVar28);
  auVar6 = vpaddd_avx2(auVar9,auVar6);
  local_9e0 = vpaddd_avx2(auVar7,auVar6);
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1b0);
  iVar12 = -iVar17;
  auVar29._4_4_ = iVar12;
  auVar29._0_4_ = iVar12;
  auVar29._8_4_ = iVar12;
  auVar29._12_4_ = iVar12;
  auVar29._16_4_ = iVar12;
  auVar29._20_4_ = iVar12;
  auVar29._24_4_ = iVar12;
  auVar29._28_4_ = iVar12;
  auVar6 = vpmulld_avx2(local_9c0,auVar29);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x210);
  auVar32._4_4_ = uVar1;
  auVar32._0_4_ = uVar1;
  auVar32._8_4_ = uVar1;
  auVar32._12_4_ = uVar1;
  auVar32._16_4_ = uVar1;
  auVar32._20_4_ = uVar1;
  auVar32._24_4_ = uVar1;
  auVar32._28_4_ = uVar1;
  auVar6 = vpaddd_avx2(auVar6,auVar9);
  auVar7 = vpmulld_avx2(local_9a0,auVar32);
  local_a00 = vpaddd_avx2(auVar6,auVar7);
  auVar25._4_4_ = iVar17;
  auVar25._0_4_ = iVar17;
  auVar25._8_4_ = iVar17;
  auVar25._12_4_ = iVar17;
  auVar25._16_4_ = iVar17;
  auVar25._20_4_ = iVar17;
  auVar25._24_4_ = iVar17;
  auVar25._28_4_ = iVar17;
  auVar6 = vpmulld_avx2(local_9c0,auVar32);
  auVar7 = vpmulld_avx2(local_9a0,auVar25);
  auVar6 = vpaddd_avx2(auVar6,auVar9);
  local_a20 = vpaddd_avx2(auVar6,auVar7);
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar14 + 400);
  iVar12 = -iVar17;
  auVar30._4_4_ = iVar12;
  auVar30._0_4_ = iVar12;
  auVar30._8_4_ = iVar12;
  auVar30._12_4_ = iVar12;
  auVar30._16_4_ = iVar12;
  auVar30._20_4_ = iVar12;
  auVar30._24_4_ = iVar12;
  auVar30._28_4_ = iVar12;
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar14 + 0x230);
  auVar33._4_4_ = iVar12;
  auVar33._0_4_ = iVar12;
  auVar33._8_4_ = iVar12;
  auVar33._12_4_ = iVar12;
  auVar33._16_4_ = iVar12;
  auVar33._20_4_ = iVar12;
  auVar33._24_4_ = iVar12;
  auVar33._28_4_ = iVar12;
  auVar7 = vpmulld_avx2(local_a60,auVar30);
  auVar6 = vpmulld_avx2(local_a40,auVar33);
  auVar6 = vpaddd_avx2(auVar9,auVar6);
  local_a80 = vpaddd_avx2(auVar7,auVar6);
  auVar26._4_4_ = iVar17;
  auVar26._0_4_ = iVar17;
  auVar26._8_4_ = iVar17;
  auVar26._12_4_ = iVar17;
  auVar26._16_4_ = iVar17;
  auVar26._20_4_ = iVar17;
  auVar26._24_4_ = iVar17;
  auVar26._28_4_ = iVar17;
  auVar7 = vpmulld_avx2(local_a60,auVar33);
  auVar6 = vpmulld_avx2(local_a40,auVar26);
  auVar6 = vpaddd_avx2(auVar9,auVar6);
  auVar6 = vpaddd_avx2(auVar7,auVar6);
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x180);
  iVar12 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x240);
  auVar35._4_4_ = iVar12;
  auVar35._0_4_ = iVar12;
  auVar35._8_4_ = iVar12;
  auVar35._12_4_ = iVar12;
  auVar35._16_4_ = iVar12;
  auVar35._20_4_ = iVar12;
  auVar35._24_4_ = iVar12;
  auVar35._28_4_ = iVar12;
  iVar16 = -iVar17;
  auVar42._4_4_ = iVar16;
  auVar42._0_4_ = iVar16;
  auVar42._8_4_ = iVar16;
  auVar42._12_4_ = iVar16;
  auVar42._16_4_ = iVar16;
  auVar42._20_4_ = iVar16;
  auVar42._24_4_ = iVar16;
  auVar42._28_4_ = iVar16;
  auVar7 = vpmulld_avx2(local_660,auVar42);
  auVar7 = vpaddd_avx2(auVar7,auVar9);
  auVar19 = vpmulld_avx2(local_480,auVar35);
  auVar7 = vpaddd_avx2(auVar7,auVar19);
  local_980._4_4_ = iVar17;
  local_980._0_4_ = iVar17;
  local_980._8_4_ = iVar17;
  local_980._12_4_ = iVar17;
  local_980._16_4_ = iVar17;
  local_980._20_4_ = iVar17;
  local_980._24_4_ = iVar17;
  local_980._28_4_ = iVar17;
  auVar19 = vpmulld_avx2(local_660,auVar35);
  auVar19 = vpaddd_avx2(auVar19,auVar9);
  auVar18 = vpmulld_avx2(local_480,local_980);
  auVar19 = vpaddd_avx2(auVar19,auVar18);
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1c0);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar14 + 0x200);
  iVar16 = -iVar17;
  local_bc0._4_4_ = iVar16;
  local_bc0._0_4_ = iVar16;
  local_bc0._8_4_ = iVar16;
  local_bc0._12_4_ = iVar16;
  local_bc0._16_4_ = iVar16;
  local_bc0._20_4_ = iVar16;
  local_bc0._24_4_ = iVar16;
  local_bc0._28_4_ = iVar16;
  auStack_bd0 = auVar31._16_16_;
  local_be0 = ZEXT416(uVar2);
  iVar16 = -uVar2;
  local_920._4_4_ = iVar16;
  local_920._0_4_ = iVar16;
  local_920._8_4_ = iVar16;
  local_920._12_4_ = iVar16;
  local_920._16_4_ = iVar16;
  local_920._20_4_ = iVar16;
  local_920._24_4_ = iVar16;
  local_920._28_4_ = iVar16;
  auVar18 = vpmulld_avx2(local_560,local_920);
  auVar18 = vpaddd_avx2(auVar9,auVar18);
  auVar20 = vpmulld_avx2(local_580,local_bc0);
  auVar18 = vpaddd_avx2(auVar20,auVar18);
  local_900._4_4_ = iVar17;
  local_900._0_4_ = iVar17;
  local_900._8_4_ = iVar17;
  local_900._12_4_ = iVar17;
  local_900._16_4_ = iVar17;
  local_900._20_4_ = iVar17;
  local_900._24_4_ = iVar17;
  local_900._28_4_ = iVar17;
  auVar20 = vpmulld_avx2(local_560,local_900);
  auVar20 = vpaddd_avx2(auVar9,auVar20);
  auVar31 = vpmulld_avx2(local_580,local_920);
  local_aa0 = vpaddd_avx2(auVar31,auVar20);
  auVar20 = vpaddd_avx2(auVar9,auVar27);
  local_940 = vpsrad_avx2(auVar20,auVar40);
  local_680 = local_940;
  auVar20 = vpaddd_avx2(auVar9,auVar34);
  local_c40 = vpsrad_avx2(auVar20,auVar40);
  auVar40 = ZEXT416((uint)bit);
  local_440 = vpsrad_avx2(auVar3,auVar40);
  local_760 = local_c40;
  local_a0 = vpsrad_avx2(auVar4,auVar40);
  local_960 = vpsrad_avx2(auVar5,auVar40);
  local_3a0 = vpsrad_avx2(local_9e0,auVar40);
  local_340 = vpsrad_avx2(local_a00,auVar40);
  local_140 = local_960;
  local_c60 = vpsrad_avx2(local_a20,auVar40);
  local_1a0 = local_c60;
  local_2a0 = vpsrad_avx2(local_a80,auVar40);
  local_240 = vpsrad_avx2(auVar6,auVar40);
  local_640 = vpsrad_avx2(auVar7,auVar40);
  local_4a0 = vpsrad_avx2(auVar19,auVar40);
  local_5a0 = vpsrad_avx2(auVar18,auVar40);
  local_540 = vpsrad_avx2(local_aa0,auVar40);
  local_c00._4_4_ = local_b60;
  local_c00._0_4_ = local_b60;
  local_c00._8_4_ = local_b60;
  local_c00._12_4_ = local_b60;
  local_c00._16_4_ = local_b60;
  local_c00._20_4_ = local_b60;
  local_c00._24_4_ = local_b60;
  local_c00._28_4_ = local_b60;
  auVar3 = vpmulld_avx2(local_c40,local_c00);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar7._4_4_ = local_b40;
  auVar7._0_4_ = local_b40;
  auVar7._8_4_ = local_b40;
  auVar7._12_4_ = local_b40;
  auVar7._16_4_ = local_b40;
  auVar7._20_4_ = local_b40;
  auVar7._24_4_ = local_b40;
  auVar7._28_4_ = local_b40;
  auVar4 = vpmulld_avx2(local_940,auVar7);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4._4_4_ = local_c80;
  auVar4._0_4_ = local_c80;
  auVar4._8_4_ = local_c80;
  auVar4._12_4_ = local_c80;
  auVar4._16_4_ = local_c80;
  auVar4._20_4_ = local_c80;
  auVar4._24_4_ = local_c80;
  auVar4._28_4_ = local_c80;
  auVar5 = vpmulld_avx2((undefined1  [32])*in,auVar4);
  auVar4 = vpmulld_avx2(auVar7,local_c40);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  local_c20._4_4_ = local_b20;
  local_c20._0_4_ = local_b20;
  local_c20._8_4_ = local_b20;
  local_c20._12_4_ = local_b20;
  local_c20._16_4_ = local_b20;
  local_c20._20_4_ = local_b20;
  local_c20._24_4_ = local_b20;
  local_c20._28_4_ = local_b20;
  auVar6 = vpmulld_avx2(local_c20,local_940);
  auVar4 = vpaddd_avx2(auVar6,auVar4);
  auVar5 = vpaddd_avx2(auVar5,auVar9);
  alVar8 = (__m256i)vpsrad_avx2(auVar5,auVar40);
  local_840[0] = alVar8[0];
  local_840[1] = alVar8[1];
  local_840[2] = alVar8[2];
  local_840[3] = alVar8[3];
  local_860[0] = alVar8[0];
  local_860[1] = alVar8[1];
  local_860[2] = alVar8[2];
  local_860[3] = alVar8[3];
  local_740 = vpsrad_avx2(auVar3,auVar40);
  local_6a0 = vpsrad_avx2(auVar4,auVar40);
  auVar3 = vpmulld_avx2(local_440,auVar42);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar4 = vpmulld_avx2(local_a0,auVar35);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_440,auVar35);
  auVar5 = vpmulld_avx2(local_a0,local_980);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  local_420 = vpsrad_avx2(auVar3,auVar40);
  auVar40 = ZEXT416((uint)bit);
  local_c0 = vpsrad_avx2(auVar4,auVar40);
  auVar3 = vpmulld_avx2(local_8a0,auVar42);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar4 = vpmulld_avx2(local_880,auVar35);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar5 = vpmulld_avx2(local_880,local_980);
  auVar4 = vpmulld_avx2(local_8a0,auVar35);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  local_e0 = vpsrad_avx2(auVar4,auVar40);
  local_400 = vpsrad_avx2(auVar3,auVar40);
  auVar3 = vpmulld_avx2(local_8e0,auVar35);
  auVar3 = vpaddd_avx2(auVar9,auVar3);
  auVar4 = vpmulld_avx2(local_8c0,auVar42);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  iVar12 = -iVar12;
  auVar36._4_4_ = iVar12;
  auVar36._0_4_ = iVar12;
  auVar36._8_4_ = iVar12;
  auVar36._12_4_ = iVar12;
  auVar36._16_4_ = iVar12;
  auVar36._20_4_ = iVar12;
  auVar36._24_4_ = iVar12;
  auVar36._28_4_ = iVar12;
  auVar5 = vpmulld_avx2(local_8c0,auVar36);
  auVar4 = vpmulld_avx2(local_8e0,auVar42);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  local_100 = vpsrad_avx2(auVar3,auVar40);
  auVar3 = vpaddd_avx2(auVar4,auVar5);
  local_3e0 = vpsrad_avx2(auVar3,auVar40);
  auVar3 = vpmulld_avx2(local_3a0,auVar36);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar4 = vpmulld_avx2(local_960,auVar42);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_3a0,auVar42);
  auVar5 = vpmulld_avx2(local_960,auVar35);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  local_120 = vpsrad_avx2(auVar4,auVar40);
  local_3c0 = vpsrad_avx2(auVar3,auVar40);
  auVar3 = vpmulld_avx2(local_340,local_920);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar4 = vpmulld_avx2(local_c60,local_900);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar37._4_4_ = uVar2;
  auVar37._0_4_ = uVar2;
  auVar37._8_4_ = uVar2;
  auVar37._12_4_ = uVar2;
  auVar37._16_4_ = uVar2;
  auVar37._20_4_ = uVar2;
  auVar37._24_4_ = uVar2;
  auVar37._28_4_ = uVar2;
  auVar4 = vpmulld_avx2(local_340,local_900);
  auVar5 = vpmulld_avx2(local_c60,auVar37);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  local_320 = vpsrad_avx2(auVar3,auVar40);
  local_1c0 = vpsrad_avx2(auVar4,auVar40);
  auVar3 = vpmulld_avx2(local_9a0,local_900);
  auVar3 = vpaddd_avx2(auVar9,auVar3);
  auVar4 = vpmulld_avx2(local_9c0,local_920);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  local_300 = vpsrad_avx2(auVar3,auVar40);
  auVar4 = vpmulld_avx2(local_9a0,auVar37);
  auVar3 = vpmulld_avx2(local_9c0,local_900);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_1e0 = vpsrad_avx2(auVar3,auVar40);
  auVar3 = vpmulld_avx2(local_a60,local_bc0);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar4 = vpmulld_avx2(local_a40,local_920);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_2e0 = vpsrad_avx2(auVar3,auVar40);
  auVar4 = vpmulld_avx2(local_a60,local_920);
  auVar3 = vpmulld_avx2(local_a40,local_900);
  auVar3 = vpaddd_avx2(auVar9,auVar3);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  local_200 = vpsrad_avx2(auVar3,auVar40);
  auVar3 = vpmulld_avx2(local_2a0,local_bc0);
  auVar4 = vpmulld_avx2(local_240,local_920);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar5 = vpmulld_avx2(local_2a0,local_920);
  auVar4 = vpmulld_avx2(local_240,local_900);
  auVar4 = vpaddd_avx2(auVar9,auVar4);
  auVar4 = vpaddd_avx2(auVar5,auVar4);
  local_220 = vpsrad_avx2(auVar4,auVar40);
  local_2c0 = vpsrad_avx2(auVar3,auVar40);
  local_800[0] = alVar8[0];
  local_800[1] = alVar8[1];
  local_800[2] = alVar8[2];
  local_800[3] = alVar8[3];
  local_820[0] = alVar8[0];
  local_820[1] = alVar8[1];
  local_820[2] = alVar8[2];
  local_820[3] = alVar8[3];
  local_700 = local_c40._0_8_;
  uStack_6f8 = local_c40._8_8_;
  uStack_6f0 = local_c40._16_8_;
  uStack_6e8 = local_c40._24_8_;
  local_720 = local_740;
  local_6e0 = local_940._0_8_;
  uStack_6d8 = local_940._8_8_;
  uStack_6d0 = local_940._16_8_;
  uStack_6c8 = local_940._24_8_;
  local_6c0 = local_6a0;
  auVar3 = vpmulld_avx2(local_640,local_c00);
  auVar4 = vpmulld_avx2(local_4a0,auVar7);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_620 = vpsrad_avx2(auVar3,auVar40);
  auVar3 = vpmulld_avx2(local_640,auVar7);
  auVar4 = vpmulld_avx2(local_4a0,local_c20);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_4c0 = vpsrad_avx2(auVar3,auVar40);
  auVar3 = vpmulld_avx2(local_660,local_c00);
  auVar4 = vpmulld_avx2(local_480,auVar7);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_600 = vpsrad_avx2(auVar3,auVar40);
  auVar3 = vpmulld_avx2(local_660,auVar7);
  auVar4 = vpmulld_avx2(local_480,local_c20);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_4e0 = vpsrad_avx2(auVar3,auVar40);
  auVar5._4_4_ = local_b80;
  auVar5._0_4_ = local_b80;
  auVar5._8_4_ = local_b80;
  auVar5._12_4_ = local_b80;
  auVar5._16_4_ = local_b80;
  auVar5._20_4_ = local_b80;
  auVar5._24_4_ = local_b80;
  auVar5._28_4_ = local_b80;
  auVar3 = vpmulld_avx2(local_580,auVar5);
  auVar4 = vpmulld_avx2(local_560,local_c00);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_5e0 = vpsrad_avx2(auVar3,auVar40);
  auVar3 = vpmulld_avx2(local_580,local_c00);
  auVar4 = vpmulld_avx2(local_560,auVar7);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_500 = vpsrad_avx2(auVar3,auVar40);
  auVar3 = vpmulld_avx2(local_5a0,auVar5);
  auVar4 = vpmulld_avx2(local_540,local_c00);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_5a0,local_c00);
  auVar5 = vpmulld_avx2(local_540,auVar7);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  local_5c0 = vpsrad_avx2(auVar3,auVar40);
  auVar3 = vpaddd_avx2(auVar4,auVar5);
  local_520 = vpsrad_avx2(auVar3,auVar40);
  auVar6._4_4_ = local_ae0;
  auVar6._0_4_ = local_ae0;
  auVar6._8_4_ = local_ae0;
  auVar6._12_4_ = local_ae0;
  auVar6._16_4_ = local_ae0;
  auVar6._20_4_ = local_ae0;
  auVar6._24_4_ = local_ae0;
  auVar6._28_4_ = local_ae0;
  auVar3._4_4_ = local_b00;
  auVar3._0_4_ = local_b00;
  auVar3._8_4_ = local_b00;
  auVar3._12_4_ = local_b00;
  auVar3._16_4_ = local_b00;
  auVar3._20_4_ = local_b00;
  auVar3._24_4_ = local_b00;
  auVar3._28_4_ = local_b00;
  for (uVar13 = 0x20; (uVar13 & 0xffffffc0) == 0; uVar13 = uVar13 + 0x10) {
    uVar15 = uVar13;
    for (lVar14 = 0; lVar14 != 0x80; lVar14 = lVar14 + 0x20) {
      auVar4 = vpaddd_avx2(*(undefined1 (*) [32])(local_860 + (uVar15 ^ 7) * 4),
                           *(undefined1 (*) [32])(puVar10 + lVar14));
      auVar7 = vpsubd_avx2(*(undefined1 (*) [32])(puVar10 + lVar14),
                           *(undefined1 (*) [32])(local_860 + (uVar15 ^ 7) * 4));
      auVar4 = vpmaxsd_avx2(auVar4,auVar6);
      auVar5 = vpminsd_avx2(auVar4,auVar3);
      auVar4 = vpmaxsd_avx2(auVar7,auVar6);
      auVar4 = vpminsd_avx2(auVar4,auVar3);
      *(undefined1 (*) [32])(puVar10 + lVar14) = auVar5;
      *(undefined1 (*) [32])(local_860 + (uVar15 ^ 7) * 4) = auVar4;
      auVar4 = vpaddd_avx2(*(undefined1 (*) [32])(local_860 + (uVar15 ^ 8) * 4),
                           *(undefined1 (*) [32])(local_860 + (uVar15 ^ 0xf) * 4));
      auVar7 = vpsubd_avx2(*(undefined1 (*) [32])(local_860 + (uVar15 ^ 0xf) * 4),
                           *(undefined1 (*) [32])(local_860 + (uVar15 ^ 8) * 4));
      auVar4 = vpmaxsd_avx2(auVar4,auVar6);
      auVar5 = vpminsd_avx2(auVar4,auVar3);
      auVar4 = vpmaxsd_avx2(auVar7,auVar6);
      auVar4 = vpminsd_avx2(auVar4,auVar3);
      *(undefined1 (*) [32])(local_860 + (uVar15 ^ 0xf) * 4) = auVar5;
      *(undefined1 (*) [32])(local_860 + (uVar15 ^ 8) * 4) = auVar4;
      uVar15 = uVar15 + 1;
    }
    puVar10 = puVar10 + 0x200;
  }
  local_780 = local_860[0];
  lStack_778 = local_860[1];
  lStack_770 = local_860[2];
  lStack_768 = local_860[3];
  local_7a0 = local_840[0];
  lStack_798 = local_840[1];
  lStack_790 = local_840[2];
  lStack_788 = local_840[3];
  local_7c0 = local_820[0];
  lStack_7b8 = local_820[1];
  lStack_7b0 = local_820[2];
  lStack_7a8 = local_820[3];
  local_7e0 = local_800[0];
  lStack_7d8 = local_800[1];
  lStack_7d0 = local_800[2];
  lStack_7c8 = local_800[3];
  iStack_c7c = local_c80;
  iStack_c78 = local_c80;
  iStack_c74 = local_c80;
  iStack_c70 = local_c80;
  iStack_c6c = local_c80;
  iStack_c68 = local_c80;
  iStack_c64 = local_c80;
  iStack_b9c = local_ba0;
  iStack_b98 = local_ba0;
  iStack_b94 = local_ba0;
  iStack_b90 = local_ba0;
  iStack_b8c = local_ba0;
  iStack_b88 = local_ba0;
  iStack_b84 = local_ba0;
  iStack_b7c = local_b80;
  iStack_b78 = local_b80;
  iStack_b74 = local_b80;
  iStack_b70 = local_b80;
  iStack_b6c = local_b80;
  iStack_b68 = local_b80;
  iStack_b64 = local_b80;
  iStack_b5c = local_b60;
  iStack_b58 = local_b60;
  iStack_b54 = local_b60;
  iStack_b50 = local_b60;
  iStack_b4c = local_b60;
  iStack_b48 = local_b60;
  iStack_b44 = local_b60;
  iStack_b3c = local_b40;
  iStack_b38 = local_b40;
  iStack_b34 = local_b40;
  iStack_b30 = local_b40;
  iStack_b2c = local_b40;
  iStack_b28 = local_b40;
  iStack_b24 = local_b40;
  iStack_b1c = local_b20;
  iStack_b18 = local_b20;
  iStack_b14 = local_b20;
  iStack_b10 = local_b20;
  iStack_b0c = local_b20;
  iStack_b08 = local_b20;
  iStack_b04 = local_b20;
  iStack_afc = local_b00;
  iStack_af8 = local_b00;
  iStack_af4 = local_b00;
  iStack_af0 = local_b00;
  iStack_aec = local_b00;
  iStack_ae8 = local_b00;
  iStack_ae4 = local_b00;
  iStack_adc = local_ae0;
  iStack_ad8 = local_ae0;
  iStack_ad4 = local_ae0;
  iStack_ad0 = local_ae0;
  iStack_acc = local_ae0;
  iStack_ac8 = local_ae0;
  iStack_ac4 = local_ae0;
  iStack_abc = local_ac0;
  iStack_ab8 = local_ac0;
  iStack_ab4 = local_ac0;
  iStack_ab0 = local_ac0;
  iStack_aac = local_ac0;
  iStack_aa8 = local_ac0;
  iStack_aa4 = local_ac0;
  idct64_stage8_avx2(&local_860,(__m256i *)&local_ba0,(__m256i *)&local_c80,(__m256i *)&local_b60,
                     (__m256i *)&local_b40,(__m256i *)&local_b20,(__m256i *)&local_b80,
                     (__m256i *)&local_ae0,(__m256i *)&local_b00,(__m256i *)&local_ac0,bit);
  idct64_stage9_avx2(&local_860,(__m256i *)&local_ba0,(__m256i *)&local_c80,(__m256i *)&local_ae0,
                     (__m256i *)&local_b00,(__m256i *)&local_ac0,bit);
  idct64_stage10_avx2(&local_860,(__m256i *)&local_ba0,(__m256i *)&local_c80,(__m256i *)&local_ae0,
                      (__m256i *)&local_b00,(__m256i *)&local_ac0,bit);
  idct64_stage11_avx2(&local_860,out,do_cols,bd,out_shift,(__m256i *)&local_ae0,
                      (__m256i *)&local_b00);
  return;
}

Assistant:

static void idct64_low8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);

  const __m256i cospi1 = _mm256_set1_epi32(cospi[1]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi3 = _mm256_set1_epi32(cospi[3]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospim4 = _mm256_set1_epi32(-cospi[4]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospim12 = _mm256_set1_epi32(-cospi[12]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospim20 = _mm256_set1_epi32(-cospi[20]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospim28 = _mm256_set1_epi32(-cospi[28]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospi63 = _mm256_set1_epi32(cospi[63]);
  const __m256i cospim57 = _mm256_set1_epi32(-cospi[57]);
  const __m256i cospi7 = _mm256_set1_epi32(cospi[7]);
  const __m256i cospi5 = _mm256_set1_epi32(cospi[5]);
  const __m256i cospi59 = _mm256_set1_epi32(cospi[59]);
  const __m256i cospim61 = _mm256_set1_epi32(-cospi[61]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);

  {
    __m256i u[64];

    // stage 1
    u[0] = in[0];
    u[8] = in[4];
    u[16] = in[2];
    u[24] = in[6];
    u[32] = in[1];
    u[40] = in[5];
    u[48] = in[3];
    u[56] = in[7];

    // stage 2
    u[63] = half_btf_0_avx2(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_avx2(&cospi63, &u[32], &rnding, bit);
    u[39] = half_btf_0_avx2(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_avx2(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_avx2(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_avx2(&cospi59, &u[40], &rnding, bit);
    u[47] = half_btf_0_avx2(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_avx2(&cospi3, &u[48], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_avx2(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_avx2(&cospi62, &u[16], &rnding, bit);
    u[23] = half_btf_0_avx2(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_avx2(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[38] = u[39];
    u[41] = u[40];
    u[46] = u[47];
    u[49] = u[48];
    u[54] = u[55];
    u[57] = u[56];
    u[62] = u[63];

    // stage 4
    __m256i temp1, temp2;
    u[15] = half_btf_0_avx2(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_avx2(&cospi60, &u[8], &rnding, bit);
    u[17] = u[16];
    u[22] = u[23];
    u[25] = u[24];
    u[30] = u[31];

    temp1 = half_btf_avx2(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    u[62] = half_btf_avx2(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = temp1;

    temp2 = half_btf_avx2(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[38] = half_btf_avx2(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = temp2;

    temp1 = half_btf_avx2(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    u[54] = half_btf_avx2(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = temp1;

    temp2 = half_btf_avx2(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_avx2(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[46] = temp2;

    // stage 5
    u[9] = u[8];
    u[14] = u[15];

    temp1 = half_btf_avx2(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    u[30] = half_btf_avx2(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = temp1;

    temp2 = half_btf_avx2(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_avx2(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[22] = temp2;

    u[35] = u[32];
    u[34] = u[33];
    u[36] = u[39];
    u[37] = u[38];
    u[43] = u[40];
    u[42] = u[41];
    u[44] = u[47];
    u[45] = u[46];
    u[51] = u[48];
    u[50] = u[49];
    u[52] = u[55];
    u[53] = u[54];
    u[59] = u[56];
    u[58] = u[57];
    u[60] = u[63];
    u[61] = u[62];

    // stage 6
    temp1 = half_btf_0_avx2(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_avx2(&cospi32, &u[0], &rnding, bit);
    u[0] = temp1;

    temp2 = half_btf_avx2(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_avx2(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = temp2;
    u[19] = u[16];
    u[18] = u[17];
    u[20] = u[23];
    u[21] = u[22];
    u[27] = u[24];
    u[26] = u[25];
    u[28] = u[31];
    u[29] = u[30];

    temp1 = half_btf_avx2(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    u[61] = half_btf_avx2(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = temp1;
    temp2 = half_btf_avx2(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    u[60] = half_btf_avx2(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[35] = temp2;
    temp1 = half_btf_avx2(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    u[59] = half_btf_avx2(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[36] = temp1;
    temp2 = half_btf_avx2(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_avx2(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[37] = temp2;
    temp1 = half_btf_avx2(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    u[53] = half_btf_avx2(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = temp1;
    temp2 = half_btf_avx2(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    u[52] = half_btf_avx2(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[43] = temp2;
    temp1 = half_btf_avx2(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    u[51] = half_btf_avx2(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[44] = temp1;
    temp2 = half_btf_avx2(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_avx2(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[45] = temp2;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    u[11] = u[8];
    u[10] = u[9];
    u[12] = u[15];
    u[13] = u[14];

    temp1 = half_btf_avx2(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    u[29] = half_btf_avx2(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = temp1;
    temp2 = half_btf_avx2(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    u[28] = half_btf_avx2(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[19] = temp2;
    temp1 = half_btf_avx2(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    u[27] = half_btf_avx2(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[20] = temp1;
    temp2 = half_btf_avx2(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_avx2(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[21] = temp2;
    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_avx2(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_avx2(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                    &clamp_hi);
      }
    }

    // stage 8
    u[7] = u[0];
    u[6] = u[1];
    u[5] = u[2];
    u[4] = u[3];

    idct64_stage8_avx2(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_avx2(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                       bit);

    // stage 10
    idct64_stage10_avx2(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                        bit);

    // stage 11
    idct64_stage11_avx2(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}